

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

ssize_t __thiscall r_comp::Class::write(Class *this,int __fd,void *__buf,size_t __n)

{
  pointer pSVar1;
  uint uVar2;
  ulong uVar3;
  void *__buf_00;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  undefined4 *puVar4;
  long lVar5;
  StructureMember *member;
  pointer this_00;
  undefined1 auVar6 [16];
  
  puVar4 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  *puVar4 = *(undefined4 *)this;
  r_code::WriteString(puVar4 + 1,(string *)&this->str_opcode);
  auVar6 = r_code::GetStringSize((string *)&this->str_opcode);
  __buf_00 = auVar6._8_8_;
  lVar5 = auVar6._0_8_;
  *(undefined8 *)(puVar4 + lVar5 + 1) = *(undefined8 *)&this->type;
  this_00 = (this->things_to_read).
            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->things_to_read).
           super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (int)((ulong)((long)pSVar1 - (long)this_00) >> 5) * -0x55555555;
  uVar3 = (ulong)uVar2;
  puVar4[lVar5 + 3] = uVar2;
  if (pSVar1 != this_00) {
    lVar5 = lVar5 + 4;
    do {
      StructureMember::write(this_00,__fd + (int)lVar5 * 4,__buf_00,__n);
      uVar3 = StructureMember::get_size(this_00);
      lVar5 = lVar5 + uVar3;
      this_00 = this_00 + 1;
      __buf_00 = extraout_RDX;
    } while (this_00 != pSVar1);
  }
  return uVar3;
}

Assistant:

void Class::write(uint32_t *storage)
{
    storage[0] = atom.atom;
    r_code::WriteString(storage + 1, str_opcode);
    uint64_t offset = 1 + r_code::GetStringSize(str_opcode);
    storage[offset++] = type;
    storage[offset++] = use_as;
    storage[offset++] = things_to_read.size();

    for (StructureMember &member : things_to_read) {
        member.write(storage + offset);
        offset += member.get_size();
    }
}